

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bms_channel.cpp
# Opt level: O0

int __thiscall BmsChannel::GetChannelType(BmsChannel *this)

{
  int iVar1;
  int c;
  BmsChannel *this_local;
  
  iVar1 = BmsWord::ToInteger(&this->channel_number_);
  if (iVar1 == 1) {
    this_local._4_4_ = 1;
  }
  else if (iVar1 == 2) {
    this_local._4_4_ = 2;
  }
  else if (iVar1 == 3) {
    this_local._4_4_ = 3;
  }
  else if (iVar1 == 4) {
    this_local._4_4_ = 4;
  }
  else if (iVar1 == 5) {
    this_local._4_4_ = 5;
  }
  else if (iVar1 == 6) {
    this_local._4_4_ = 6;
  }
  else if (iVar1 == 7) {
    this_local._4_4_ = 7;
  }
  else if (iVar1 == 8) {
    this_local._4_4_ = 8;
  }
  else if (iVar1 == 9) {
    this_local._4_4_ = 9;
  }
  else if (iVar1 == 10) {
    this_local._4_4_ = 10;
  }
  else if (iVar1 == 0xb) {
    this_local._4_4_ = 0x3ea;
  }
  else if (iVar1 == 0xc) {
    this_local._4_4_ = 0x3eb;
  }
  else if (iVar1 == 0xd) {
    this_local._4_4_ = 0x3ec;
  }
  else if (iVar1 == 0xe) {
    this_local._4_4_ = 0x3ed;
  }
  else if (iVar1 == 0x16d) {
    this_local._4_4_ = 0x3e9;
  }
  else if (iVar1 == 0x169) {
    this_local._4_4_ = 0x3ee;
  }
  else if (iVar1 == 0x16a) {
    this_local._4_4_ = 0x3ef;
  }
  else if (iVar1 == 0x16b) {
    this_local._4_4_ = 0x3f0;
  }
  else if (iVar1 == 0x16c) {
    this_local._4_4_ = 0x3f1;
  }
  else if ((iVar1 < 0x25) || (0x47 < iVar1)) {
    if ((iVar1 < 0x49) || (0x6b < iVar1)) {
      if ((iVar1 < 0x6d) || (0x8f < iVar1)) {
        if ((iVar1 < 0x91) || (0xb3 < iVar1)) {
          if ((iVar1 < 0xb5) || (0xd7 < iVar1)) {
            if ((iVar1 < 0xd9) || (0xfb < iVar1)) {
              if ((iVar1 < 0x1d5) || (0x1f7 < iVar1)) {
                if ((iVar1 < 0x1f9) || (0x21b < iVar1)) {
                  this_local._4_4_ = 0;
                }
                else {
                  this_local._4_4_ = 0x8d;
                }
              }
              else {
                this_local._4_4_ = 0x83;
              }
            }
            else {
              this_local._4_4_ = 0x3d;
            }
          }
          else {
            this_local._4_4_ = 0x33;
          }
        }
        else {
          this_local._4_4_ = 0x29;
        }
      }
      else {
        this_local._4_4_ = 0x1f;
      }
    }
    else {
      this_local._4_4_ = 0x15;
    }
  }
  else {
    this_local._4_4_ = 0xb;
  }
  return this_local._4_4_;
}

Assistant:

int BmsChannel::GetChannelType() const {
	int c = channel_number_.ToInteger();
	if (c == 1)
		return BmsChannelType::BGM;
	else if (c == 2)
		return BmsChannelType::MEASURELENGTH;
	else if (c == 3)
		return BmsChannelType::BPM;
	else if (c == 4)
		return BmsChannelType::BGA;
	else if (c == 5)
		return BmsChannelType::EXTOBJ;
	else if (c == 6)
		return BmsChannelType::BGAPOOR;
	else if (c == 7)
		return BmsChannelType::BGALAYER;
	else if (c == 8)
		return BmsChannelType::EXTBPM;
	else if (c == 9)
		return BmsChannelType::STOP;
	else if (c == 10)
		return BmsChannelType::BGALAYER2;
	else if (c == 11)
		return BmsChannelType::BGAOPAC;
	else if (c == 12)
		return BmsChannelType::BGALAYEROPAC;
	else if (c == 13)
		return BmsChannelType::BGALAYER2OPAC;
	else if (c == 14)
		return BmsChannelType::BGAPOOROPAC;
	else if (c == 365)
		return BmsChannelType::BGAKEYBOUND;
	else if (c == 361)
		return BmsChannelType::BGAARGB;
	else if (c == 362)
		return BmsChannelType::BGALAYERARGB;
	else if (c == 363)
		return BmsChannelType::BGALAYER2ARGB;
	else if (c == 364)
		return BmsChannelType::BGAPOORARGB;
	else if (37 <= c && c < 72)
		return BmsChannelType::FIRSTPLAYER;
	else if (73 <= c && c < 108)
		return BmsChannelType::SECONDPLAYER;
	else if (109 <= c && c < 144)
		return BmsChannelType::FIRSTPLAYERHIDDEN;
	else if (145 <= c && c < 180)
		return BmsChannelType::SECONDPLAYERHIDDEN;
	else if (181 <= c && c < 216)
		return BmsChannelType::FIRSTPLAYERLN;
	else if (217 <= c && c < 252)
		return BmsChannelType::SECONDPLAYERLN;
	else if (469 <= c && c < 504)
		return BmsChannelType::FIRSTPLAYERMINE;
	else if (505 <= c && c < 540)
		return BmsChannelType::SECONDPLAYERMINE;
	return 0;	// unknown
}